

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

UBool haveAliasData(UErrorCode *pErrorCode)

{
  ushort uVar1;
  UBool UVar2;
  UDataMemory *pData;
  uint *puVar3;
  uint uVar4;
  
  if (U_ZERO_ERROR < *pErrorCode) goto LAB_002b1eeb;
  if ((gAliasDataInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
     (UVar2 = icu_63::umtx_initImplPreInit(&gAliasDataInitOnce), UVar2 == '\0')) {
    if (U_ZERO_ERROR < gAliasDataInitOnce.fErrCode) {
      *pErrorCode = gAliasDataInitOnce.fErrCode;
    }
    goto LAB_002b1eeb;
  }
  ucln_common_registerCleanup_63(UCLN_COMMON_UCNV_IO,ucnv_io_cleanup);
  pData = udata_openChoice_63((char *)0x0,"icu","cnvalias",isAcceptable,(void *)0x0,pErrorCode);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    puVar3 = (uint *)udata_getMemory_63(pData);
    uVar4 = *puVar3;
    if (uVar4 < 8) {
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      udata_close_63(pData);
    }
    else {
      gMainTable.converterListSize = puVar3[1];
      gMainTable.tagListSize = puVar3[2];
      gMainTable.aliasListSize = puVar3[3];
      gMainTable.untaggedConvArraySize = puVar3[4];
      gMainTable.taggedAliasArraySize = puVar3[5];
      gMainTable.taggedAliasListsSize = puVar3[6];
      gMainTable.optionTableSize = puVar3[7];
      gMainTable.stringTableSize = puVar3[8];
      if (uVar4 != 8) {
        gMainTable.normalizedStringTableSize = puVar3[9];
      }
      gMainTable.converterList = (uint16_t *)((long)puVar3 + (ulong)(uVar4 * 2 + 2) * 2);
      uVar4 = gMainTable.converterListSize + uVar4 * 2 + 2;
      gMainTable.tagList = (uint16_t *)((long)puVar3 + (ulong)uVar4 * 2);
      uVar4 = gMainTable.tagListSize + uVar4;
      gMainTable.aliasList = (uint16_t *)((long)puVar3 + (ulong)uVar4 * 2);
      uVar4 = gMainTable.aliasListSize + uVar4;
      gMainTable.untaggedConvArray = (uint16_t *)((long)puVar3 + (ulong)uVar4 * 2);
      uVar4 = gMainTable.untaggedConvArraySize + uVar4;
      gMainTable.taggedAliasArray = (uint16_t *)((long)puVar3 + (ulong)uVar4 * 2);
      uVar4 = gMainTable.taggedAliasArraySize + uVar4;
      gMainTable.taggedAliasLists = (uint16_t *)((long)puVar3 + (ulong)uVar4 * 2);
      uVar4 = gMainTable.taggedAliasListsSize + uVar4;
      gAliasData = pData;
      if (gMainTable.optionTableSize != 0) {
        uVar1 = *(ushort *)((long)puVar3 + (ulong)uVar4 * 2);
        if (uVar1 < 2) {
          gMainTable.optionTable = (UConverterAliasOptions *)((long)puVar3 + (ulong)uVar4 * 2);
          gMainTable.stringTable =
               (uint16_t *)((long)puVar3 + (ulong)(gMainTable.optionTableSize + uVar4) * 2);
          gMainTable.normalizedStringTable =
               (uint16_t *)
               ((long)puVar3 +
               (ulong)(gMainTable.stringTableSize + gMainTable.optionTableSize + uVar4) * 2);
          if (uVar1 == 0) {
            gMainTable.normalizedStringTable = gMainTable.stringTable;
          }
          goto LAB_002b1ed7;
        }
      }
      gMainTable.optionTable = &defaultTableOptions;
      gMainTable.stringTable =
           (uint16_t *)((long)puVar3 + (ulong)(gMainTable.optionTableSize + uVar4) * 2);
      gMainTable.normalizedStringTable = gMainTable.stringTable;
    }
  }
LAB_002b1ed7:
  gAliasDataInitOnce.fErrCode = *pErrorCode;
  icu_63::umtx_initImplPostInit(&gAliasDataInitOnce);
LAB_002b1eeb:
  return *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

static UBool
haveAliasData(UErrorCode *pErrorCode) {
    umtx_initOnce(gAliasDataInitOnce, &initAliasData, *pErrorCode);
    return U_SUCCESS(*pErrorCode);
}